

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPreviewImage.cpp
# Opt level: O0

void __thiscall Imf_3_4::PreviewImage::PreviewImage(PreviewImage *this,PreviewImage *other)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  PreviewRgba *pPVar4;
  int *in_RSI;
  int *in_RDI;
  uint i;
  PreviewRgba *local_50;
  uint local_20;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  uVar2 = CONCAT44(0,*in_RSI * in_RSI[1]);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pPVar4 = (PreviewRgba *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_50 = pPVar4;
    do {
      PreviewRgba::PreviewRgba(local_50,'\0','\0','\0',0xff);
      local_50 = local_50 + 1;
    } while (local_50 != pPVar4 + uVar2);
  }
  *(PreviewRgba **)(in_RDI + 2) = pPVar4;
  for (local_20 = 0; local_20 < (uint)(*in_RDI * in_RDI[1]); local_20 = local_20 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 2) + (ulong)local_20 * 4) =
         *(undefined4 *)(*(long *)(in_RSI + 2) + (ulong)local_20 * 4);
  }
  return;
}

Assistant:

PreviewImage::PreviewImage (const PreviewImage& other)
    : _width (other._width)
    , _height (other._height)
    , _pixels (new PreviewRgba[other._width * other._height])
{
    for (unsigned int i = 0; i < _width * _height; ++i)
        _pixels[i] = other._pixels[i];
}